

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32
png_get_cHRM_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr,png_fixed_point *white_x,
                  png_fixed_point *white_y,png_fixed_point *red_x,png_fixed_point *red_y,
                  png_fixed_point *green_x,png_fixed_point *green_y,png_fixed_point *blue_x,
                  png_fixed_point *blue_y)

{
  png_fixed_point *red_y_local;
  png_fixed_point *red_x_local;
  png_fixed_point *white_y_local;
  png_fixed_point *white_x_local;
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if (((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_const_inforp)0x0)) ||
     (((info_ptr->colorspace).flags & 2) == 0)) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    if (white_x != (png_fixed_point *)0x0) {
      *white_x = (info_ptr->colorspace).end_points_xy.whitex;
    }
    if (white_y != (png_fixed_point *)0x0) {
      *white_y = (info_ptr->colorspace).end_points_xy.whitey;
    }
    if (red_x != (png_fixed_point *)0x0) {
      *red_x = (info_ptr->colorspace).end_points_xy.redx;
    }
    if (red_y != (png_fixed_point *)0x0) {
      *red_y = (info_ptr->colorspace).end_points_xy.redy;
    }
    if (green_x != (png_fixed_point *)0x0) {
      *green_x = (info_ptr->colorspace).end_points_xy.greenx;
    }
    if (green_y != (png_fixed_point *)0x0) {
      *green_y = (info_ptr->colorspace).end_points_xy.greeny;
    }
    if (blue_x != (png_fixed_point *)0x0) {
      *blue_x = (info_ptr->colorspace).end_points_xy.bluex;
    }
    if (blue_y != (png_fixed_point *)0x0) {
      *blue_y = (info_ptr->colorspace).end_points_xy.bluey;
    }
    png_ptr_local._4_4_ = 4;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 PNGAPI
png_get_cHRM_fixed(png_const_structrp png_ptr, png_const_inforp info_ptr,
    png_fixed_point *white_x, png_fixed_point *white_y, png_fixed_point *red_x,
    png_fixed_point *red_y, png_fixed_point *green_x, png_fixed_point *green_y,
    png_fixed_point *blue_x, png_fixed_point *blue_y)
{
   png_debug1(1, "in %s retrieval function", "cHRM");

   if (png_ptr != NULL && info_ptr != NULL &&
      (info_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_ENDPOINTS) != 0)
   {
      if (white_x != NULL)
         *white_x = info_ptr->colorspace.end_points_xy.whitex;
      if (white_y != NULL)
         *white_y = info_ptr->colorspace.end_points_xy.whitey;
      if (red_x != NULL)
         *red_x = info_ptr->colorspace.end_points_xy.redx;
      if (red_y != NULL)
         *red_y = info_ptr->colorspace.end_points_xy.redy;
      if (green_x != NULL)
         *green_x = info_ptr->colorspace.end_points_xy.greenx;
      if (green_y != NULL)
         *green_y = info_ptr->colorspace.end_points_xy.greeny;
      if (blue_x != NULL)
         *blue_x = info_ptr->colorspace.end_points_xy.bluex;
      if (blue_y != NULL)
         *blue_y = info_ptr->colorspace.end_points_xy.bluey;
      return (PNG_INFO_cHRM);
   }

   return (0);
}